

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  undefined8 *puVar1;
  ImVec2 *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVector<ImDrawCmd> IVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  ImDrawListSplitter *pIVar10;
  ImDrawCmd *pIVar11;
  ImDrawChannel *pIVar12;
  undefined1 (*pauVar13) [16];
  undefined1 auVar14 [12];
  undefined8 uVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  int n;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ImDrawChannel *pIVar21;
  long lVar22;
  ImVector<ImDrawCmd> *pIVar23;
  char *__function;
  undefined4 extraout_EDX;
  int iVar24;
  ulong uVar25;
  int iVar26;
  ImBitArray<132> *pIVar27;
  ImGuiTableColumn *pIVar28;
  long lVar29;
  uint uVar30;
  byte bVar31;
  float *pfVar32;
  uint uVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 uVar39;
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  ImBitArray<132> local_128;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8 [2];
  undefined8 uStack_d0;
  int iStack_c8;
  ImBitArray<132> local_c4 [7];
  
  pIVar16 = GImGui;
  pIVar10 = table->DrawSplitter;
  if (pIVar10->_Current != 0) {
    __assert_fail("splitter->_Current == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x918,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
  }
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  uVar30 = 0;
  memset(local_d8,0,0xa0);
  iVar18 = table->ColumnsCount;
  if (0 < iVar18) {
    uVar25 = 0;
    do {
      if ((table->VisibleMaskByIndex >> (uVar25 & 0x3f) & 1) != 0) {
        pIVar28 = (table->Columns).Data + uVar25;
        if ((table->Columns).DataEnd <= pIVar28) {
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_internal.h"
                        ,0x24a,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]"
                       );
        }
        uVar33 = 1;
        do {
          bVar31 = (byte)uVar33;
          bVar9 = *(byte *)((long)&pIVar28->Flags + ((ulong)uVar33 ^ 0x59));
          if ((pIVar10->_Channels).Size <= (int)(uint)bVar9) goto LAB_001664d9;
          pIVar21 = (pIVar10->_Channels).Data;
          iVar18 = pIVar21[bVar9]._CmdBuffer.Size;
          if (0 < (long)iVar18) {
            pIVar21 = pIVar21 + bVar9;
            if ((pIVar21->_CmdBuffer).Data[(long)iVar18 + -1].ElemCount == 0) {
              iVar18 = iVar18 + -1;
              (pIVar21->_CmdBuffer).Size = iVar18;
            }
            if (iVar18 == 1) {
              if ((pIVar28->Flags & 0x100) == 0) {
                if (cVar7 < '\x01') {
                  fVar3 = pIVar28->ContentMaxXUnfrozen;
LAB_00165f3d:
                  uVar33 = -(uint)(pIVar28->ContentMaxXHeadersUsed <= fVar3);
                  fVar3 = (float)(~uVar33 & (uint)pIVar28->ContentMaxXHeadersUsed |
                                 (uint)fVar3 & uVar33);
                }
                else {
                  if (bVar31 != 0) {
                    fVar3 = pIVar28->ContentMaxXFrozen;
                    goto LAB_00165f3d;
                  }
                  fVar3 = pIVar28->ContentMaxXUnfrozen;
                }
                pIVar2 = &(pIVar28->ClipRect).Max;
                if (pIVar2->x <= fVar3 && fVar3 != pIVar2->x) goto LAB_00166052;
              }
              if (cVar8 < '\x01') {
                uVar33 = 1;
              }
              else {
                uVar33 = (uint)((long)table->FreezeColumnsCount <= (long)uVar25);
              }
              uVar19 = ((byte)~bVar31 & 1) * 2;
              if (cVar7 < '\x01') {
                uVar19 = 2;
              }
              if (0x83 < bVar9) {
                __assert_fail("channel_no < (4 + 64 * 2)",
                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                              ,0x949,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
              }
              uVar20 = (ulong)(uVar33 | uVar19);
              pfVar32 = local_d8 + uVar20 * 10;
              if ((&iStack_c8)[uVar20 * 10] == 0) {
                pfVar32[0] = 3.4028235e+38;
                pfVar32[1] = 3.4028235e+38;
                (&uStack_d0)[uVar20 * 5] = 0xff7fffffff7fffff;
              }
              ImBitArray<132>::SetBit(local_c4 + uVar20 * 2,(uint)bVar9);
              (&iStack_c8)[uVar20 * 10] = (&iStack_c8)[uVar20 * 10] + 1;
              if ((pIVar21->_CmdBuffer).Size < 1) {
                __function = "T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]";
                goto LAB_001664ee;
              }
              pIVar11 = (pIVar21->_CmdBuffer).Data;
              fVar3 = (pIVar11->ClipRect).x;
              fVar4 = (pIVar11->ClipRect).y;
              fVar34 = (pIVar11->ClipRect).z;
              fVar5 = (pIVar11->ClipRect).w;
              if (fVar3 < *pfVar32) {
                *pfVar32 = fVar3;
              }
              if (fVar4 < local_d8[uVar20 * 10 + 1]) {
                local_d8[uVar20 * 10 + 1] = fVar4;
              }
              if (*(float *)(&uStack_d0 + uVar20 * 5) <= fVar34 &&
                  fVar34 != *(float *)(&uStack_d0 + uVar20 * 5)) {
                *(float *)(&uStack_d0 + uVar20 * 5) = fVar34;
              }
              pfVar32 = (float *)((long)&uStack_d0 + uVar20 * 0x28 + 4);
              if (*pfVar32 <= fVar5 && fVar5 != *pfVar32) {
                *(float *)((long)&uStack_d0 + uVar20 * 0x28 + 4) = fVar5;
              }
              uVar30 = uVar30 | 1 << (uVar33 | uVar19);
            }
          }
LAB_00166052:
          uVar33 = 0;
        } while (('\0' < cVar7 & bVar31) != 0);
        pIVar28->DrawChannelCurrent = 0xff;
        iVar18 = table->ColumnsCount;
      }
      uVar25 = uVar25 + 1;
    } while ((long)uVar25 < (long)iVar18);
    if (uVar30 != 0) {
      iVar24 = pIVar10->_Count;
      iVar18 = iVar24 + -2;
      iVar26 = (pIVar16->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar26 < iVar18) {
        if (iVar26 == 0) {
          iVar26 = 8;
        }
        else {
          iVar26 = iVar26 / 2 + iVar26;
        }
        if (iVar26 <= iVar18) {
          iVar26 = iVar18;
        }
        pIVar21 = (ImDrawChannel *)MemAlloc((long)iVar26 << 5);
        pIVar12 = (pIVar16->DrawChannelsTempMergeBuffer).Data;
        if (pIVar12 != (ImDrawChannel *)0x0) {
          memcpy(pIVar21,pIVar12,(long)(pIVar16->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar16->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar16->DrawChannelsTempMergeBuffer).Data = pIVar21;
        (pIVar16->DrawChannelsTempMergeBuffer).Capacity = iVar26;
        iVar24 = pIVar10->_Count;
      }
      else {
        pIVar21 = (pIVar16->DrawChannelsTempMergeBuffer).Data;
      }
      (pIVar16->DrawChannelsTempMergeBuffer).Size = iVar18;
      local_128.Storage[0] = 0;
      local_128.Storage[1] = 0;
      local_128.Storage[2] = 0;
      local_128.Storage[3] = 0;
      local_128.Storage[4] = 0;
      ImBitArray<132>::SetBitRange(&local_128,2,iVar24);
      ImBitArray<132>::ClearBit(&local_128,(uint)table->Bg2DrawChannelUnfrozen);
      if (cVar7 < '\x01') {
        iVar18 = -2;
      }
      else {
        iVar18 = -3;
        if (table->Bg2DrawChannelUnfrozen == '\x01') {
          __assert_fail("has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                        ,0x974,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
        }
      }
      iVar18 = iVar18 + pIVar10->_Count;
      fVar3 = (table->HostClipRect).Min.x;
      fVar4 = (table->HostClipRect).Min.y;
      local_f8 = ZEXT416((uint)(table->HostClipRect).Max.x);
      local_108 = ZEXT416((uint)(table->HostClipRect).Max.y);
      pIVar27 = local_c4;
      uVar25 = 0;
      do {
        iVar26 = (&iStack_c8)[uVar25 * 10];
        if (iVar26 != 0) {
          auVar36 = *(undefined1 (*) [16])(local_d8 + uVar25 * 10);
          if ((uVar25 & 1) == 0 || cVar8 < '\x01') {
            auVar35 = auVar36;
            if (fVar3 <= auVar36._0_4_) {
              auVar35._4_12_ = auVar36._4_12_;
              auVar35._0_4_ = fVar3;
            }
            auVar36._0_4_ = auVar35._0_4_;
          }
          if (uVar25 < 2 || cVar7 < '\x01') {
            fVar34 = auVar36._4_4_;
            if (fVar4 <= auVar36._4_4_) {
              fVar34 = fVar4;
            }
            uVar39 = auVar36._0_4_;
            auVar36._4_4_ = fVar34;
            auVar36._0_4_ = uVar39;
          }
          if ((uVar25 & 1) != 0) {
            uVar30 = -(uint)((float)local_f8._0_4_ <= auVar36._8_4_);
            auVar36._8_4_ = ~uVar30 & local_f8._0_4_ | (uint)auVar36._8_4_ & uVar30;
          }
          if ((1 < uVar25) && ((table->Flags & 0x20000) == 0)) {
            uVar30 = -(uint)((float)local_108._0_4_ <= auVar36._12_4_);
            auVar36._12_4_ = ~uVar30 & local_108._0_4_ | (uint)auVar36._12_4_ & uVar30;
          }
          lVar22 = 0;
          do {
            local_128.Storage[lVar22] = local_128.Storage[lVar22] & ~pIVar27->Storage[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 5);
          iVar18 = iVar18 - iVar26;
          if (0 < pIVar10->_Count) {
            lVar22 = 0;
            lVar29 = 0;
            local_e8 = auVar36;
            do {
              bVar17 = ImBitArray<132>::TestBit(local_c4 + uVar25 * 2,(int)lVar29);
              if (bVar17) {
                ImBitArray<132>::ClearBit(local_c4 + uVar25 * 2,(int)lVar29);
                if ((pIVar10->_Channels).Size <= lVar29) goto LAB_001664d9;
                pIVar12 = (pIVar10->_Channels).Data;
                if (*(int *)((long)&(pIVar12->_CmdBuffer).Size + lVar22) != 1) {
LAB_001664f8:
                  __assert_fail("channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                                ,0x99f,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
                }
                pauVar13 = *(undefined1 (**) [16])((long)&(pIVar12->_CmdBuffer).Data + lVar22);
                auVar35 = *pauVar13;
                local_148 = auVar36._0_4_;
                fStack_144 = auVar36._4_4_;
                fStack_140 = auVar36._8_4_;
                fStack_13c = auVar36._12_4_;
                auVar38._4_4_ = -(uint)(fStack_144 <= auVar35._4_4_);
                auVar38._0_4_ = -(uint)(local_148 <= auVar35._0_4_);
                auVar14._4_8_ = auVar35._8_8_;
                auVar14._0_4_ = -(uint)(auVar35._4_4_ <= fStack_144);
                auVar37._0_8_ = auVar14._0_8_ << 0x20;
                auVar37._8_4_ = -(uint)(auVar35._8_4_ <= fStack_140);
                auVar37._12_4_ = -(uint)(auVar35._12_4_ <= fStack_13c);
                auVar38._8_8_ = auVar37._8_8_;
                iVar24 = movmskps(extraout_EDX,auVar38);
                if (iVar24 != 0xf) goto LAB_001664f8;
                iVar26 = iVar26 + -1;
                pIVar23 = (ImVector<ImDrawCmd> *)((long)&(pIVar12->_CmdBuffer).Size + lVar22);
                *(undefined8 *)*pauVar13 = local_e8._0_8_;
                *(undefined8 *)(*pauVar13 + 8) = local_e8._8_8_;
                IVar6 = *pIVar23;
                iVar24 = pIVar23[1].Capacity;
                pIVar11 = pIVar23[1].Data;
                (pIVar21->_IdxBuffer).Size = pIVar23[1].Size;
                (pIVar21->_IdxBuffer).Capacity = iVar24;
                (pIVar21->_IdxBuffer).Data = (unsigned_short *)pIVar11;
                pIVar21->_CmdBuffer = IVar6;
                pIVar21 = pIVar21 + 1;
              }
              lVar29 = lVar29 + 1;
            } while ((lVar29 < pIVar10->_Count) && (lVar22 = lVar22 + 0x20, iVar26 != 0));
          }
        }
        if (uVar25 == 1 && '\0' < cVar7) {
          bVar9 = table->Bg2DrawChannelUnfrozen;
          if ((pIVar10->_Channels).Size <= (int)(uint)bVar9) goto LAB_001664d9;
          pIVar12 = (pIVar10->_Channels).Data;
          IVar6 = pIVar12[bVar9]._CmdBuffer;
          pIVar21->_IdxBuffer = pIVar12[bVar9]._IdxBuffer;
          pIVar21->_CmdBuffer = IVar6;
          pIVar21 = pIVar21 + 1;
        }
        uVar25 = uVar25 + 1;
        pIVar27 = pIVar27 + 2;
      } while (uVar25 != 4);
      iVar26 = pIVar10->_Count;
      if ((0 < iVar26) && (iVar18 != 0)) {
        lVar22 = 0;
        lVar29 = 0;
        do {
          bVar17 = ImBitArray<132>::TestBit(&local_128,(int)lVar29);
          if (bVar17) {
            if ((pIVar10->_Channels).Size <= lVar29) {
LAB_001664d9:
              __function = "T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]";
LAB_001664ee:
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                            ,0x706,__function);
            }
            pIVar12 = (pIVar10->_Channels).Data;
            puVar1 = (undefined8 *)((long)&(pIVar12->_CmdBuffer).Size + lVar22);
            uVar15 = *puVar1;
            pIVar11 = (ImDrawCmd *)puVar1[1];
            pIVar21->_IdxBuffer =
                 *(ImVector<unsigned_short> *)((long)&(pIVar12->_IdxBuffer).Size + lVar22);
            (pIVar21->_CmdBuffer).Size = (int)uVar15;
            (pIVar21->_CmdBuffer).Capacity = (int)((ulong)uVar15 >> 0x20);
            (pIVar21->_CmdBuffer).Data = pIVar11;
            pIVar21 = pIVar21 + 1;
            iVar18 = iVar18 + -1;
          }
          lVar29 = lVar29 + 1;
          iVar26 = pIVar10->_Count;
        } while ((lVar29 < iVar26) && (lVar22 = lVar22 + 0x20, iVar18 != 0));
      }
      pIVar12 = (pIVar16->DrawChannelsTempMergeBuffer).Data;
      if (pIVar21 != pIVar12 + (pIVar16->DrawChannelsTempMergeBuffer).Size) {
        __assert_fail("dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                      ,0x9b3,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
      }
      memcpy((pIVar10->_Channels).Data + 2,pIVar12,(long)iVar26 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}